

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printSeq(JSPrinter *this,Ref node)

{
  undefined8 *puVar1;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
  printChild(this,(Value *)*puVar1,(Ref)this_local,-1);
  emit(this,',');
  space(this);
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
  printChild(this,(Value *)*puVar1,(Ref)this_local,1);
  return;
}

Assistant:

void printSeq(Ref node) {
    printChild(node[1], node, -1);
    emit(',');
    space();
    printChild(node[2], node, 1);
  }